

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void duckdb::BaseModeFunction<duckdb::ModeString>::
     Combine<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::EntropyFallbackFunction<duckdb::ModeString>>
               (ModeState<duckdb::string_t,_duckdb::ModeString> *source,
               ModeState<duckdb::string_t,_duckdb::ModeString> *target,AggregateInputData *param_3)

{
  Counts *pCVar1;
  size_t sVar2;
  undefined4 uVar3;
  mapped_type *pmVar4;
  Counts *pCVar5;
  _Hash_node_base *p_Var6;
  Counts *__range3;
  _Hash_node_base *p_Var7;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>_>_>
  local_28;
  
  pCVar1 = source->frequency_map;
  if (pCVar1 != (Counts *)0x0) {
    if (target->frequency_map == (Counts *)0x0) {
      pCVar5 = (Counts *)operator_new(0x48);
      pCVar5->allocator = pCVar1->allocator;
      local_28._M_h = (__hashtable_alloc *)&pCVar5->map;
      (pCVar5->map)._M_h._M_buckets = (__buckets_ptr)0x0;
      (pCVar5->map)._M_h._M_bucket_count = (pCVar1->map)._M_h._M_bucket_count;
      (pCVar5->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (pCVar5->map)._M_h._M_element_count = (pCVar1->map)._M_h._M_element_count;
      uVar3 = *(undefined4 *)&(pCVar1->map)._M_h._M_rehash_policy.field_0x4;
      sVar2 = (pCVar1->map)._M_h._M_rehash_policy._M_next_resize;
      (pCVar5->map)._M_h._M_rehash_policy._M_max_load_factor =
           (pCVar1->map)._M_h._M_rehash_policy._M_max_load_factor;
      *(undefined4 *)&(pCVar5->map)._M_h._M_rehash_policy.field_0x4 = uVar3;
      (pCVar5->map)._M_h._M_rehash_policy._M_next_resize = sVar2;
      (pCVar5->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      ::std::
      _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,duckdb::ModeAttr>,std::allocator<std::pair<duckdb::string_t_const,duckdb::ModeAttr>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,duckdb::ModeAttr>,std::allocator<std::pair<duckdb::string_t_const,duckdb::ModeAttr>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<duckdb::string_t_const,duckdb::ModeAttr>,true>>>>
                ((_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,duckdb::ModeAttr>,std::allocator<std::pair<duckdb::string_t_const,duckdb::ModeAttr>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_28._M_h,&(pCVar1->map)._M_h,&local_28);
      pCVar5->free_type = pCVar1->free_type;
      target->frequency_map = pCVar5;
      target->count = source->count;
    }
    else {
      for (p_Var7 = (pCVar1->map)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
          p_Var7 = p_Var7->_M_nxt) {
        pmVar4 = OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
                 ::GetOrCreate(target->frequency_map,
                               (key_type)
                               ((anon_union_16_2_67f50693_for_value *)(p_Var7 + 1))->pointer);
        pmVar4->count = (long)&(p_Var7[3]._M_nxt)->_M_nxt + pmVar4->count;
        p_Var6 = p_Var7[4]._M_nxt;
        if ((_Hash_node_base *)pmVar4->first_row < p_Var7[4]._M_nxt) {
          p_Var6 = (_Hash_node_base *)pmVar4->first_row;
        }
        pmVar4->first_row = (idx_t)p_Var6;
      }
      target->count = target->count + source->count;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.frequency_map) {
			return;
		}
		if (!target.frequency_map) {
			// Copy - don't destroy! Otherwise windowing will break.
			target.frequency_map = new typename STATE::Counts(*source.frequency_map);
			target.count = source.count;
			return;
		}
		for (auto &val : *source.frequency_map) {
			auto &i = (*target.frequency_map)[val.first];
			i.count += val.second.count;
			i.first_row = MinValue(i.first_row, val.second.first_row);
		}
		target.count += source.count;
	}